

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

bool netbase_tests::TestParse(string *src,string *canon)

{
  __type_conflict _Var1;
  long in_FS_OFFSET;
  CService addr;
  DNSLookupFn in_stack_ffffffffffffff78;
  string local_68;
  CService local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&stack0xffffffffffffff78,&g_dns_lookup_abi_cxx11_);
  LookupNumeric(&local_48,src,0xffff,in_stack_ffffffffffffff78);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff78);
  CService::ToStringAddrPort_abi_cxx11_(&local_68,&local_48);
  _Var1 = std::operator==(canon,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return _Var1;
  }
  __stack_chk_fail();
}

Assistant:

bool static TestParse(std::string src, std::string canon)
{
    CService addr(LookupNumeric(src, 65535));
    return canon == addr.ToStringAddrPort();
}